

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QScrollerPrivate::ScrollSegment>::reallocateAndGrow
          (QArrayDataPointer<QScrollerPrivate::ScrollSegment> *this,GrowthPosition where,qsizetype n
          ,QArrayDataPointer<QScrollerPrivate::ScrollSegment> *old)

{
  ScrollSegment *pSVar1;
  QArrayData *pQVar2;
  Data *pDVar3;
  qsizetype qVar4;
  qint64 qVar5;
  qint64 qVar6;
  qreal qVar7;
  ScrollSegment *pSVar8;
  long lVar9;
  ScrollSegment *pSVar10;
  ScrollSegment *pSVar11;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  QArrayDataPointer<QScrollerPrivate::ScrollSegment> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<QScrollerPrivate::ScrollSegment> *)0x0 && where == GrowsAtEnd) &&
       (pQVar2 = &this->d->super_QArrayData, pQVar2 != (QArrayData *)0x0)) && (0 < n)) &&
     ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i < 2)) {
    auVar12 = QArrayData::reallocateUnaligned
                        (pQVar2,this->ptr,0x40,
                         n + this->size +
                         ((long)((long)this->ptr -
                                ((ulong)((long)&pQVar2[1].alloc + 7U) & 0xfffffffffffffff0)) >> 6),
                         Grow);
    this->d = (Data *)auVar12._0_8_;
    this->ptr = (ScrollSegment *)auVar12._8_8_;
  }
  else {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (ScrollSegment *)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_58,this,n,where);
    pSVar8 = local_58.ptr;
    if (this->size != 0) {
      lVar9 = this->size + (n >> 0x3f & n);
      if (((this->d == (Data *)0x0) ||
          (old != (QArrayDataPointer<QScrollerPrivate::ScrollSegment> *)0x0)) ||
         (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        pSVar10 = this->ptr;
        pSVar11 = pSVar10 + lVar9;
        if ((lVar9 != 0) && (0 < lVar9)) {
          do {
            qVar5 = pSVar10->startTime;
            qVar6 = pSVar10->deltaTime;
            qVar7 = pSVar10->deltaPos;
            pSVar1 = pSVar8 + local_58.size;
            pSVar1->startPos = pSVar10->startPos;
            pSVar1->deltaPos = qVar7;
            pSVar1->startTime = qVar5;
            pSVar1->deltaTime = qVar6;
            QEasingCurve::QEasingCurve(&pSVar1->curve,&pSVar10->curve);
            pSVar1->type = pSVar10->type;
            qVar7 = pSVar10->stopPos;
            pSVar1->stopProgress = pSVar10->stopProgress;
            pSVar1->stopPos = qVar7;
            local_58.size = local_58.size + 1;
            pSVar10 = pSVar10 + 1;
          } while (pSVar10 < pSVar11);
        }
      }
      else {
        pSVar8 = this->ptr;
        pSVar10 = pSVar8 + lVar9;
        if ((lVar9 != 0) && (0 < lVar9)) {
          do {
            qVar5 = pSVar8->startTime;
            qVar6 = pSVar8->deltaTime;
            qVar7 = pSVar8->deltaPos;
            local_58.ptr[local_58.size].startPos = pSVar8->startPos;
            (&local_58.ptr[local_58.size].startPos)[1] = qVar7;
            local_58.ptr[local_58.size].startTime = qVar5;
            local_58.ptr[local_58.size].deltaTime = qVar6;
            local_58.ptr[local_58.size].curve.d_ptr = (pSVar8->curve).d_ptr;
            (pSVar8->curve).d_ptr = (QEasingCurvePrivate *)0x0;
            local_58.ptr[local_58.size].type = pSVar8->type;
            qVar7 = pSVar8->stopPos;
            local_58.ptr[local_58.size].stopProgress = pSVar8->stopProgress;
            (&local_58.ptr[local_58.size].stopProgress)[1] = qVar7;
            pSVar8 = pSVar8 + 1;
            local_58.size = local_58.size + 1;
          } while (pSVar8 < pSVar10);
        }
      }
    }
    pDVar3 = this->d;
    pSVar8 = this->ptr;
    this->d = local_58.d;
    this->ptr = local_58.ptr;
    qVar4 = this->size;
    this->size = local_58.size;
    local_58.d = pDVar3;
    local_58.ptr = pSVar8;
    local_58.size = qVar4;
    if (old != (QArrayDataPointer<QScrollerPrivate::ScrollSegment> *)0x0) {
      local_58.d = old->d;
      local_58.ptr = old->ptr;
      old->d = pDVar3;
      old->ptr = pSVar8;
      local_58.size = old->size;
      old->size = qVar4;
    }
    ~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }